

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::parsePostIncDec(StructuralParser *this,Expression *lhs,bool isIncrement)

{
  SourceCodeText *o;
  DestructorFn *pDVar1;
  Scope *pSVar2;
  PoolItem *pPVar3;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pDVar1 = (DestructorFn *)(this->super_SOULTokeniser).location.location.data;
  pSVar2 = this->currentScope;
  pPVar3 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x40);
  pPVar3->item = &PTR__ASTObject_00301658;
  *(undefined4 *)&pPVar3->field_0x18 = 0x1c;
  pPVar3[1].size = (size_t)o;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pPVar3[1].destructor = pDVar1;
  pPVar3[1].item = pSVar2;
  *(undefined4 *)&pPVar3[1].field_0x18 = 0;
  pPVar3->item = &PTR__PreOrPostIncOrDec_00301948;
  pPVar3[2].size = (size_t)lhs;
  *(bool *)&pPVar3[2].destructor = isIncrement;
  *(undefined1 *)((long)&pPVar3[2].destructor + 1) = 1;
  pPVar3->destructor =
       PoolAllocator::
       allocate<soul::AST::PreOrPostIncOrDec,_soul::AST::Context,_soul::AST::Expression_&,_bool_&,_bool>
       ::anon_class_1_0_00000001::__invoke;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return (Expression *)&pPVar3->item;
}

Assistant:

AST::Expression& parsePostIncDec (AST::Expression& lhs, bool isIncrement)
    {
        return allocate<AST::PreOrPostIncOrDec> (getContext(), lhs, isIncrement, true);
    }